

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFFFundamentalParameterData.cpp
# Opt level: O0

void __thiscall
DIS::IFFFundamentalParameterData::marshal(IFFFundamentalParameterData *this,DataStream *dataStream)

{
  ulong local_20;
  size_t idx;
  DataStream *dataStream_local;
  IFFFundamentalParameterData *this_local;
  
  DataStream::operator<<(dataStream,this->_erp);
  DataStream::operator<<(dataStream,this->_frequency);
  DataStream::operator<<(dataStream,this->_pgrf);
  DataStream::operator<<(dataStream,this->_pulseWidth);
  DataStream::operator<<(dataStream,this->_burstLength);
  DataStream::operator<<(dataStream,this->_applicableModes);
  for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
    DataStream::operator<<(dataStream,this->_systemSpecificData[local_20]);
  }
  return;
}

Assistant:

void IFFFundamentalParameterData::marshal(DataStream& dataStream) const
{
    dataStream << _erp;
    dataStream << _frequency;
    dataStream << _pgrf;
    dataStream << _pulseWidth;
    dataStream << _burstLength;
    dataStream << _applicableModes;

     for(size_t idx = 0; idx < 3; idx++)
     {
        dataStream << _systemSpecificData[idx];
     }

}